

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O2

void __thiscall cppcms::xss::rules::rules(rules *this,string *file_name)

{
  bool bVar1;
  data *this_00;
  ostream *poVar2;
  cppcms_error *pcVar3;
  value v;
  int line_number;
  string local_3c0;
  ostringstream ss;
  ifstream f;
  byte abStack_208 [488];
  
  this_00 = (data *)operator_new(0xf8);
  data::data(this_00);
  (this->d).ptr_ = this_00;
  json::value::copyable::copyable(&v.d);
  std::ifstream::ifstream(&f,(file_name->_M_dataplus)._M_p,_S_in);
  if ((abStack_208[*(long *)(_f + -0x18)] & 5) != 0) {
    pcVar3 = (cppcms_error *)__cxa_allocate_exception(0x30);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                   "xss::rules: failed to open file: ",file_name);
    cppcms_error::cppcms_error(pcVar3,(string *)&ss);
    __cxa_throw(pcVar3,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  line_number = 0;
  bVar1 = json::value::load(&v,(istream *)&f,true,&line_number);
  if (bVar1) {
    anon_unknown_8::load_from_json(this,&v);
    std::ifstream::~ifstream(&f);
    json::value::copyable::~copyable(&v.d);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  poVar2 = std::operator<<((ostream *)&ss,"xss::rules: error parsing JSON file ");
  poVar2 = std::operator<<(poVar2,(string *)file_name);
  poVar2 = std::operator<<(poVar2," in line ");
  std::ostream::operator<<(poVar2,line_number);
  pcVar3 = (cppcms_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  cppcms_error::cppcms_error(pcVar3,&local_3c0);
  __cxa_throw(pcVar3,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

rules::rules(std::string const &file_name) : d(new data())
	{
		json::value v;
		booster::nowide::ifstream f(file_name.c_str());
		if(!f) {
			throw cppcms_error("xss::rules: failed to open file: " + file_name);
		}
		int line_number = 0;
		if(!v.load(f,true,&line_number)) {
			std::ostringstream ss;
			ss << "xss::rules: error parsing JSON file " << file_name << " in line " << line_number;
			throw cppcms_error(ss.str());
		}
		load_from_json(*this,v);
	}